

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

Array2D<double> * __thiscall
pbrt::Array2D<double>::operator=(Array2D<double> *this,Array2D<double> *other)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  bool bVar7;
  double *pdVar8;
  uint uVar9;
  ulong uVar10;
  Bounds2<int> tmp;
  
  if ((this->allocator).memoryResource == (other->allocator).memoryResource) {
    TVar4 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    TVar5 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    TVar6 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
         (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar6;
    (other->extent).pMin.super_Tuple2<pbrt::Point2,_int> = TVar4;
    (other->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar5;
    pdVar3 = this->values;
    this->values = other->values;
    other->values = pdVar3;
  }
  else {
    bVar7 = Bounds2<int>::operator==(&this->extent,&other->extent);
    iVar1 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar2 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x;
    pdVar3 = this->values;
    if (bVar7) {
      pdVar8 = other->values;
      uVar9 = ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
              (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y) * (iVar2 - iVar1);
      for (uVar10 = 0; (~((int)uVar9 >> 0x1f) & uVar9) != uVar10; uVar10 = uVar10 + 1) {
        pdVar3[uVar10] = pdVar8[uVar10];
      }
      TVar4 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
      (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
           (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
      (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar4;
    }
    else {
      pstd::pmr::polymorphic_allocator<std::byte>::deallocate_object<double>
                (&this->allocator,pdVar3,
                 (long)((iVar2 - iVar1) *
                       ((this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
                       (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y)));
      uVar9 = ((other->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y -
              (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y) *
              ((other->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x -
              (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x);
      pdVar8 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<double>
                         (&this->allocator,(long)(int)uVar9);
      this->values = pdVar8;
      pdVar3 = other->values;
      for (uVar10 = 0; (~((int)uVar9 >> 0x1f) & uVar9) != uVar10; uVar10 = uVar10 + 1) {
        pdVar8[uVar10] = pdVar3[uVar10];
      }
    }
  }
  return this;
}

Assistant:

Array2D &operator=(Array2D &&other) {
        if (allocator == other.allocator) {
            pstd::swap(extent, other.extent);
            pstd::swap(values, other.values);
        } else if (extent == other.extent) {
            int n = extent.Area();
            for (int i = 0; i < n; ++i) {
                allocator.destroy(values + i);
                allocator.construct(values + i, other.values[i]);
            }
            extent = other.extent;
        } else {
            int n = extent.Area();
            for (int i = 0; i < n; ++i)
                allocator.destroy(values + i);
            allocator.deallocate_object(values, n);

            int no = other.extent.Area();
            values = allocator.allocate_object<T>(no);
            for (int i = 0; i < no; ++i)
                allocator.construct(values + i, other.values[i]);
        }
        return *this;
    }